

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExpressionFunctionHandler.cpp
# Opt level: O1

ExpressionValue * __thiscall
ExpressionFunctionHandle::execute
          (ExpressionValue *__return_storage_ptr__,ExpressionFunctionHandle *this,
          vector<std::unique_ptr<ExpressionInternal,_std::default_delete<ExpressionInternal>_>,_std::allocator<std::unique_ptr<ExpressionInternal,_std::default_delete<ExpressionInternal>_>_>_>
          *parameters)

{
  _Any_data *p_Var1;
  ulong uVar2;
  
  uVar2 = (long)(parameters->
                super__Vector_base<std::unique_ptr<ExpressionInternal,_std::default_delete<ExpressionInternal>_>,_std::allocator<std::unique_ptr<ExpressionInternal,_std::default_delete<ExpressionInternal>_>_>_>
                )._M_impl.super__Vector_impl_data._M_finish -
          (long)(parameters->
                super__Vector_base<std::unique_ptr<ExpressionInternal,_std::default_delete<ExpressionInternal>_>,_std::allocator<std::unique_ptr<ExpressionInternal,_std::default_delete<ExpressionInternal>_>_>_>
                )._M_impl.super__Vector_impl_data._M_start >> 3;
  p_Var1 = (_Any_data *)this->impl;
  if ((uVar2 < *(ulong *)(p_Var1->_M_pod_data + 0x20)) ||
     (*(ulong *)(p_Var1->_M_pod_data + 0x28) < uVar2)) {
    (__return_storage_ptr__->strValue)._value._M_dataplus._M_p =
         (pointer)&(__return_storage_ptr__->strValue)._value.field_2;
    (__return_storage_ptr__->strValue)._value._M_string_length = 0;
    (__return_storage_ptr__->strValue)._value.field_2._M_local_buf[0] = '\0';
    __return_storage_ptr__->type = Invalid;
    (__return_storage_ptr__->field_1).intValue = 0;
  }
  else {
    if (*(long *)(p_Var1 + 1) == 0) {
      std::__throw_bad_function_call();
    }
    (**(code **)((long)p_Var1 + 0x18))(__return_storage_ptr__,p_Var1,parameters);
  }
  return __return_storage_ptr__;
}

Assistant:

ExpressionValue ExpressionFunctionHandle::execute(const std::vector<std::unique_ptr<ExpressionInternal> > &parameters) const
{
	if (parameters.size() < impl.minParams || parameters.size() > impl.maxParams)
		return {};

	return impl.f(parameters);
}